

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMinDown
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  Edge EVar2;
  btOverlappingPairCallback *pbVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000012;
  Edge *pEVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar8 = (long)axis;
  pEVar7 = this->m_pEdges[lVar8];
  uVar5 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar4 = pEVar7[uVar5 - 1].m_pos;
  if (pEVar7[uVar5].m_pos < uVar4) {
    pEVar7 = pEVar7 + uVar5;
    uVar9 = 1 << ((byte)axis & 0x1f) & 3;
    lVar12 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
             ((ulong)((uint)pEVar7->m_handle * 0x50) - 0x1c);
    uVar6 = 1 << (sbyte)uVar9 & 3;
    do {
      lVar11 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
               ((ulong)((uint)pEVar7[-1].m_handle * 0x50) - 0x1c);
      lVar10 = 0x3c;
      if ((uVar4 & 1) != 0) {
        lVar10 = 0x42;
      }
      if ((((((byte)uVar4 & 1 & updateOverlaps) == 1) &&
           (lVar10 = 0x42,
           *(ushort *)(lVar11 + 0x3c + (ulong)(uVar9 * 2)) <=
           *(ushort *)(lVar12 + 0x42 + (ulong)(uVar9 * 2)))) &&
          (*(ushort *)(lVar12 + 0x3c + (ulong)(uVar9 * 2)) <=
           *(ushort *)(lVar11 + 0x42 + (ulong)(uVar9 * 2)))) &&
         ((uVar5 = (ulong)(uVar6 * 2),
          *(ushort *)(lVar11 + 0x3c + uVar5) <= *(ushort *)(lVar12 + 0x42 + uVar5) &&
          (uVar5 = (ulong)(uVar6 * 2),
          *(ushort *)(lVar12 + 0x3c + uVar5) <= *(ushort *)(lVar11 + 0x42 + uVar5))))) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,lVar12,lVar11);
        pbVar3 = this->m_userPairCallback;
        if (pbVar3 != (btOverlappingPairCallback *)0x0) {
          (*pbVar3->_vptr_btOverlappingPairCallback[2])(pbVar3,lVar12,lVar11);
        }
      }
      psVar1 = (short *)(lVar11 + lVar10 + lVar8 * 2);
      *psVar1 = *psVar1 + 1;
      psVar1 = (short *)(lVar12 + 0x3c + lVar8 * 2);
      *psVar1 = *psVar1 + -1;
      EVar2 = *pEVar7;
      *pEVar7 = pEVar7[-1];
      pEVar7[-1] = EVar2;
      uVar4 = pEVar7[-2].m_pos;
      pEVar7 = pEVar7 + -1;
    } while (EVar2.m_pos < uVar4);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev,axis1,axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge,pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge,pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);

			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

}